

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

optional<bool>
anon_unknown.dwarf_17482::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  StringEntry *pSVar6;
  ulong uVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long *plVar10;
  cmSystemToolsRPathInfo *local_5c0;
  cmSystemToolsRPathInfo *local_550;
  bool local_542;
  bool local_541;
  cmAlphaNum local_540;
  cmAlphaNum local_510;
  string local_4e0;
  ulong local_4c0;
  unsigned_long j;
  cmAlphaNum local_4b0;
  cmAlphaNum local_480;
  string local_450;
  fpos<__mbstate_t> local_430;
  int local_420;
  bool local_419;
  int i_1;
  ofstream f;
  bool local_213;
  bool local_212;
  bool local_211;
  cmAlphaNum local_210;
  cmAlphaNum local_1e0;
  string local_1b0;
  bool local_189;
  undefined1 local_188 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  int i;
  StringEntry *se_runpath;
  StringEntry *se_rpath;
  char *se_name [2];
  StringEntry *se [2];
  int se_count;
  undefined1 local_110 [8];
  cmELF elf;
  cmSystemToolsRPathInfo rp [2];
  int local_3c;
  bool remove_rpath;
  int rp_count;
  bool *changed_local;
  string *emsg_local;
  AdjustCallback *adjustCallback_local;
  EmptyCallback *emptyCallback_local;
  string *file_local;
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  local_3c = 0;
  bVar1 = true;
  local_550 = (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8);
  do {
    cmSystemToolsRPathInfo::cmSystemToolsRPathInfo(local_550);
    local_550 = local_550 + 1;
  } while (local_550 != (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_110,pcVar5);
  bVar2 = cmELF::operator_cast_to_bool((cmELF *)local_110);
  if (bVar2) {
    se_name[1] = (char *)0x0;
    se_name[0] = (char *)0x0;
    pSVar6 = cmELF::GetRPath((cmELF *)local_110);
    if (pSVar6 != (StringEntry *)0x0) {
      se_name[1] = (char *)pSVar6;
    }
    se[1]._1_3_ = 0;
    se[1]._0_1_ = pSVar6 != (StringEntry *)0x0;
    pSVar6 = cmELF::GetRunPath((cmELF *)local_110);
    if (pSVar6 != (StringEntry *)0x0) {
      se_name[(long)(int)(uint)se[1] + 1] = (char *)pSVar6;
      se_name[(long)(int)(uint)se[1] + -1] = "RUNPATH";
      se[1]._0_4_ = (uint)se[1] + 1;
    }
    if ((uint)se[1] == 0) {
      outRPath.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._39_1_ = std::
                function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
                ::operator()(emptyCallback,emsg,(cmELF *)local_110);
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)((long)&file_local + 6),
                 (bool *)&outRPath.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x27);
      bVar2 = true;
    }
    else {
      outRPath.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      outRPath.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._33_3_ = 0;
      for (; (int)outRPath.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_4_ < (int)(uint)se[1];
          outRPath.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_4_ = outRPath.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_4_ + 1) {
        if ((local_3c == 0) ||
           (elf.ErrorMessage.field_2._8_8_ !=
            *(long *)(se_name[(long)(int)outRPath.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._32_4_ + 1] + 0x20))) {
          *(undefined8 *)((long)&rp[(long)local_3c + -1].Value.field_2 + 8) =
               *(undefined8 *)
                (se_name[(long)(int)outRPath.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._32_4_ + 1] + 0x20);
          rp[local_3c].Position =
               *(unsigned_long *)
                (se_name[(long)(int)outRPath.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._32_4_ + 1] + 0x28);
          std::__cxx11::string::operator=
                    ((string *)&rp[local_3c].Size,
                     se_name[(long)(int)outRPath.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._32_4_ + -1]);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_188);
          bVar2 = std::
                  function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                  ::operator()(adjustCallback,
                               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_188,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               se_name[(long)(int)outRPath.
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._32_4_ + 1],
                               se_name[(long)(int)outRPath.
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._32_4_ + -1],emsg);
          if (bVar2) {
            bVar2 = std::optional::operator_cast_to_bool((optional *)local_188);
            if (bVar2) {
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_188);
              uVar7 = std::__cxx11::string::empty();
              if ((uVar7 & 1) == 0) {
                bVar1 = false;
              }
              uVar7 = rp[local_3c].Position;
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_188);
              lVar8 = std::__cxx11::string::length();
              if (uVar7 < lVar8 + 1U) {
                if (emsg != (string *)0x0) {
                  cmAlphaNum::cmAlphaNum(&local_1e0,"The replacement path is too long for the ");
                  cmAlphaNum::cmAlphaNum
                            (&local_210,
                             se_name[(long)(int)outRPath.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._32_4_ + -1]);
                  cmStrCat<char[8]>(&local_1b0,&local_1e0,&local_210,(char (*) [8])" entry.");
                  std::__cxx11::string::operator=((string *)emsg,(string *)&local_1b0);
                  std::__cxx11::string::~string((string *)&local_1b0);
                }
                local_211 = false;
                std::optional<bool>::optional<bool,_true>
                          ((optional<bool> *)((long)&file_local + 6),&local_211);
                bVar2 = true;
                goto LAB_00122042;
              }
              pbVar9 = std::
                       optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_188);
              std::__cxx11::string::operator=
                        ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),(string *)pbVar9);
              local_3c = local_3c + 1;
            }
            else {
              bVar1 = false;
            }
            bVar2 = false;
          }
          else {
            local_189 = false;
            std::optional<bool>::optional<bool,_true>
                      ((optional<bool> *)((long)&file_local + 6),&local_189);
            bVar2 = true;
          }
LAB_00122042:
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_188);
          if (bVar2) goto LAB_0012207a;
        }
      }
      bVar2 = false;
    }
  }
  else {
    std::optional<bool>::optional((optional<bool> *)((long)&file_local + 6));
    bVar2 = true;
  }
LAB_0012207a:
  cmELF::~cmELF((cmELF *)local_110);
  if (!bVar2) {
    if (local_3c == 0) {
      local_212 = true;
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)((long)&file_local + 6),&local_212);
    }
    else if (bVar1) {
      local_213 = cmSystemTools::RemoveRPath(file,emsg,changed);
      std::optional<bool>::optional<bool,_true>
                ((optional<bool> *)((long)&file_local + 6),&local_213);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      _Var4 = std::operator|(_S_in,_S_out);
      _Var4 = std::operator|(_Var4,_S_bin);
      std::ofstream::ofstream(&i_1,pcVar5,_Var4);
      bVar3 = std::ios::operator!((ios *)((long)&i_1 + *(long *)(_i_1 + -0x18)));
      if ((bVar3 & 1) == 0) {
        for (local_420 = 0; local_420 < local_3c; local_420 = local_420 + 1) {
          std::fpos<__mbstate_t>::fpos
                    (&local_430,*(streamoff *)((long)&rp[(long)local_420 + -1].Value.field_2 + 8));
          plVar10 = (long *)std::ostream::seekp(&i_1,local_430._M_off,local_430._M_state);
          bVar3 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
          if ((bVar3 & 1) != 0) {
            if (emsg != (string *)0x0) {
              cmAlphaNum::cmAlphaNum(&local_480,"Error seeking to ");
              cmAlphaNum::cmAlphaNum(&local_4b0,(string *)&rp[local_420].Size);
              cmStrCat<char[11]>(&local_450,&local_480,&local_4b0,(char (*) [11])0x3b0fce);
              std::__cxx11::string::operator=((string *)emsg,(string *)&local_450);
              std::__cxx11::string::~string((string *)&local_450);
            }
            j._7_1_ = 0;
            std::optional<bool>::optional<bool,_true>
                      ((optional<bool> *)((long)&file_local + 6),(bool *)((long)&j + 7));
            bVar1 = true;
            goto LAB_001224a9;
          }
          std::operator<<((ostream *)&i_1,(string *)(rp[local_420].Name.field_2._M_local_buf + 8));
          for (local_4c0 = std::__cxx11::string::length(); local_4c0 < rp[local_420].Position;
              local_4c0 = local_4c0 + 1) {
            std::operator<<((ostream *)&i_1,'\0');
          }
          bVar3 = std::ios::operator!((ios *)((long)&i_1 + *(long *)(_i_1 + -0x18)));
          if ((bVar3 & 1) != 0) {
            if (emsg != (string *)0x0) {
              cmAlphaNum::cmAlphaNum(&local_510,"Error writing the new ");
              cmAlphaNum::cmAlphaNum(&local_540,(string *)&rp[local_420].Size);
              cmStrCat<char[21]>(&local_4e0,&local_510,&local_540,(char (*) [21])0x3b0ff6);
              std::__cxx11::string::operator=((string *)emsg,(string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
            }
            local_541 = false;
            std::optional<bool>::optional<bool,_true>
                      ((optional<bool> *)((long)&file_local + 6),&local_541);
            bVar1 = true;
            goto LAB_001224a9;
          }
        }
        bVar1 = false;
      }
      else {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=((string *)emsg,"Error opening file for update.");
        }
        local_419 = false;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&file_local + 6),&local_419);
        bVar1 = true;
      }
LAB_001224a9:
      std::ofstream::~ofstream(&i_1);
      if (!bVar1) {
        if (changed != (bool *)0x0) {
          *changed = true;
        }
        local_542 = true;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&file_local + 6),&local_542);
      }
    }
  }
  local_5c0 = (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8);
  do {
    local_5c0 = local_5c0 + -1;
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo(local_5c0);
  } while (local_5c0 != (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8));
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)file_local._6_2_;
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}